

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_combo_begin_text(nk_context *ctx,char *selected,int len,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_symbol_type type;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header_00;
  undefined8 uVar2;
  undefined8 uVar3;
  nk_widget_layout_states nVar4;
  int iVar5;
  long lVar6;
  nk_context *i;
  nk_style_combo *pnVar7;
  float fVar8;
  float fVar9;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect b;
  nk_rect header;
  nk_text text;
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5f32,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  if (selected == (char *)0x0) {
    __assert_fail("selected",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5f33,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5f34,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  if (win->layout != (nk_panel *)0x0) {
    nVar4 = nk_widget(&header,ctx);
    fVar9 = header.h;
    fVar8 = header.w;
    uVar2 = header._0_8_;
    if (nVar4 == NK_WIDGET_INVALID) {
      iVar5 = 0;
    }
    else {
      i = ctx;
      if ((win->layout->flags & 0x1000) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar4 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      rect_00.h = header.h;
      rect_00.w = header.w;
      r.w = header.w;
      r.x = header.x;
      r.y = header.y;
      r.h = header.h;
      iVar5 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      uVar3 = header._0_8_;
      if ((ctx->last_widget_state & 0x20) == 0) {
        if ((ctx->last_widget_state & 0x10) == 0) {
          pnVar7 = &(ctx->style).combo;
          text.text = (ctx->style).combo.label_normal;
        }
        else {
          pnVar7 = (nk_style_combo *)&(ctx->style).combo.hover;
          text.text = (ctx->style).combo.label_hover;
        }
      }
      else {
        pnVar7 = (nk_style_combo *)&(ctx->style).combo.active;
        text.text = (ctx->style).combo.label_active;
      }
      header._0_8_ = uVar3;
      if ((pnVar7->normal).type == NK_STYLE_ITEM_IMAGE) {
        text.background.r = '\0';
        text.background.g = '\0';
        text.background.b = '\0';
        text.background.a = '\0';
        r_00.w = fVar8;
        r_00.h = fVar9;
        header.x = (float)uVar2;
        header.y = SUB84(uVar2,4);
        r_00.x = header.x;
        r_00.y = header.y;
        nk_draw_image(&win->buffer,r_00,&(pnVar7->normal).data.image,(nk_color)0xffffffff);
      }
      else {
        text.background = (pnVar7->normal).data.color;
        header.x = (float)uVar2;
        header.y = SUB84(uVar2,4);
        rect_00.x = header.x;
        rect_00.y = header.y;
        nk_fill_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,text.background);
        rect.w = header.w;
        rect.x = header.x;
        rect.y = header.y;
        rect.h = header.h;
        nk_stroke_rect(&win->buffer,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar6 = 0x1be4;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar6 = (ulong)(iVar5 != 0) * 8 + 0x1be0;
      }
      type = *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar6);
      fVar8 = (ctx->style).combo.button_padding.y;
      local_40.y = header.y + fVar8;
      local_40.w = header.h - (fVar8 + fVar8);
      local_40.x = ((header.w + header.x) - header.h) - (ctx->style).combo.button_padding.x;
      nVar1 = (ctx->style).combo.button.padding;
      fVar8 = nVar1.x;
      local_50.y = nVar1.y;
      local_50.x = local_40.x + fVar8;
      local_50.h = local_40.w - (local_50.y + local_50.y);
      local_50.w = local_40.w - (fVar8 + fVar8);
      text.padding.x = 0.0;
      text.padding.y = 0.0;
      local_50.y = local_40.y + local_50.y;
      nVar1 = (ctx->style).combo.content_padding;
      fVar8 = nVar1.x;
      b.x = header.x + fVar8;
      fVar9 = nVar1.y;
      b.y = header.y + fVar9;
      b.w = (local_40.x - ((ctx->style).combo.spacing.x + fVar8)) - b.x;
      b.h = header.h - (fVar9 + fVar9);
      local_40.h = local_40.w;
      nk_widget_text(&win->buffer,b,selected,len,&text,0x11,(ctx->style).font);
      nk_draw_button_symbol
                (&win->buffer,&local_40,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,
                 type,(ctx->style).font);
      header_00.w = header.w;
      header_00.x = header.x;
      header_00.y = header.y;
      header_00.h = header.h;
      iVar5 = nk_combo_begin(ctx,win,size,(uint)(iVar5 != 0),header_00);
    }
    return iVar5;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x5f35,
                "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)");
}

Assistant:

NK_API int
nk_combo_begin_text(struct nk_context *ctx, const char *selected, int len,
    struct nk_vec2 size)
{
    const struct nk_input *in;
    struct nk_window *win;
    struct nk_style *style;

    enum nk_widget_layout_states s;
    int is_clicked = nk_false;
    struct nk_rect header;
    const struct nk_style_item *background;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(selected);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !selected)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        /* print currently selected text item */
        struct nk_rect label;
        struct nk_rect button;
        struct nk_rect content;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw selected label */
        text.padding = nk_vec2(0,0);
        label.x = header.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = button.x - (style->combo.content_padding.x + style->combo.spacing.x) - label.x;;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text,
            NK_TEXT_LEFT, ctx->style.font);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}